

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::createWidgets(QFileDialogPrivate *this)

{
  QFileDialogTreeView *pQVar1;
  QLatin1StringView str;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  bool bVar2;
  byte bVar3;
  int iVar4;
  Int value;
  QFileDialogPrivate *this_00;
  QFileSystemModel *pQVar5;
  QPlatformFileDialogHelper *pQVar6;
  QFileSystemModelPrivate *pQVar7;
  QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *this_01;
  undefined8 *puVar8;
  Ui_QFileDialog *pUVar9;
  QFSCompleter *pQVar10;
  QShortcut *pQVar11;
  QWidget *pQVar12;
  QFont *pQVar13;
  QActionGroup *this_02;
  QAction *this_03;
  QItemSelectionModel *pQVar14;
  qsizetype qVar15;
  const_iterator o;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QUrl *url;
  QList<QUrl> *__range1;
  QItemSelectionModel *selections;
  QAction *showHeader;
  int i;
  QAbstractItemModel *abstractModel;
  QActionGroup *showActionGroup;
  QHeaderView *treeHeader;
  QShortcut *shortcut;
  QPlatformFileDialogHelper *helper;
  QFileDialog *q;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QUrl> initiallySelectedFiles;
  QSettings settings;
  QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> selModel;
  QFontMetrics fm;
  QList<QUrl> initialBookmarks;
  WindowStates preState;
  QSize preSize;
  QWidget *in_stack_fffffffffffff628;
  InsertPolicy policy;
  ulong uVar16;
  code *pcVar17;
  ComponentFormattingOption flags;
  QWidget *in_stack_fffffffffffff630;
  QList<QUrl> *this_04;
  QObject *parent;
  QTreeView *this_05;
  QAbstractItemView *this_06;
  QFileDialog *this_07;
  int in_stack_fffffffffffff638;
  SizeAdjustPolicy in_stack_fffffffffffff63c;
  QFileDialogComboBox *in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff648;
  QFlagsStorage<Qt::InputMethodHint> in_stack_fffffffffffff64c;
  QFileDialogPrivate *in_stack_fffffffffffff650;
  QFileDialog *in_stack_fffffffffffff658;
  undefined8 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  undefined4 uVar18;
  FileMode in_stack_fffffffffffff66c;
  undefined4 uVar19;
  QFileDialogPrivate *in_stack_fffffffffffff670;
  QFlagsStorage<Qt::WindowState> newstate;
  undefined7 in_stack_fffffffffffff678;
  byte in_stack_fffffffffffff67f;
  QLabel *in_stack_fffffffffffff680;
  ConnectionType type;
  Object *in_stack_fffffffffffff688;
  undefined7 in_stack_fffffffffffff690;
  undefined1 in_stack_fffffffffffff697;
  QList<QUrl> *in_stack_fffffffffffff698;
  QFileSystemModel *in_stack_fffffffffffff6a0;
  QSidebar *in_stack_fffffffffffff6a8;
  QFileDialogPrivate *pQVar20;
  Function in_stack_fffffffffffff6b0;
  QFlagsStorage<QFileDialog::Option> options;
  ConnectionType in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  uint uVar21;
  undefined8 in_stack_fffffffffffff6c8;
  QFileDialogPrivate *this_08;
  QFileDialogPrivate *pQVar22;
  int local_694;
  QFileSystemModel *local_690;
  const_iterator local_4c0 [2];
  undefined1 local_4b0 [24];
  Data *local_498;
  QUrl *local_490;
  QDialog *in_stack_fffffffffffffb78;
  Ui_QFileDialog *in_stack_fffffffffffffb80;
  QUrl local_3d8 [7];
  undefined4 local_39c;
  QFlag local_398 [12];
  undefined1 local_368 [24];
  undefined1 local_350 [24];
  undefined1 *local_338;
  undefined1 *local_330;
  code *local_328;
  undefined8 local_320;
  Connection local_318;
  code *local_310;
  undefined8 uStack_308;
  Connection local_300;
  code *local_2f8;
  undefined8 uStack_2f0;
  Connection local_2e8;
  code *local_2e0;
  undefined8 uStack_2d8;
  Connection local_2d0;
  code *local_2c8;
  undefined8 uStack_2c0;
  Connection local_2b8;
  QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> local_2b0;
  undefined1 local_2a8 [24];
  code *local_290;
  undefined8 local_288;
  Connection local_280;
  undefined1 local_278 [24];
  undefined1 local_260 [24];
  undefined1 local_248 [24];
  undefined1 local_230 [24];
  undefined1 *local_218;
  code *local_210;
  undefined8 uStack_208;
  Connection local_200;
  code *local_1f8;
  undefined8 uStack_1f0;
  Connection local_1e8;
  code *local_1e0;
  undefined8 uStack_1d8;
  Connection local_1d0;
  code *local_1c8;
  undefined8 local_1c0;
  Connection local_1b8;
  code *local_1b0;
  undefined8 uStack_1a8;
  Connection local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188 [16];
  undefined8 uStack_178;
  Connection local_170;
  code *local_168;
  undefined8 uStack_160;
  Connection local_158 [2];
  code *local_148;
  undefined8 uStack_140;
  Connection local_138;
  undefined8 local_130;
  undefined8 local_128;
  Connection local_120;
  undefined8 local_118;
  __uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> local_110;
  Connection local_108;
  code *local_100;
  QWidget *pQStack_f8;
  Connection local_f0 [4];
  QUrl local_d0;
  undefined1 local_c8 [24];
  QUrl local_b0;
  QRegion local_a8;
  Data *pDStack_a0;
  char16_t *local_98;
  code *local_90;
  undefined8 uStack_88;
  Connection local_80;
  code *local_78;
  qsizetype qStack_70;
  Connection local_68;
  code *local_60;
  qsizetype qStack_58;
  Connection local_50 [3];
  QFlagsStorageHelper<Qt::WindowState,_4> local_34;
  QSize local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QScopedPointer::operator_cast_to_bool
                    ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                     0x751f60);
  if (!bVar2) {
    this_00 = (QFileDialogPrivate *)q_func(in_RDI);
    local_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                       (WidgetAttribute)((ulong)in_stack_fffffffffffff630 >> 0x20));
    if (bVar2) {
      local_30 = QWidget::size(in_stack_fffffffffffff628);
    }
    else {
      QSize::QSize((QSize *)in_stack_fffffffffffff630);
    }
    local_34.super_QFlagsStorage<Qt::WindowState>.i = (QFlagsStorage<Qt::WindowState>)0xaaaaaaaa;
    local_34.super_QFlagsStorage<Qt::WindowState>.i =
         (QFlagsStorage<Qt::WindowState>)QWidget::windowState(in_stack_fffffffffffff630);
    pQVar5 = (QFileSystemModel *)operator_new(0x10);
    QFileSystemModel::QFileSystemModel(pQVar5,(QObject *)this_00);
    in_RDI->model = pQVar5;
    QFileSystemModel::setIconProvider((QAbstractFileIconProvider *)in_RDI->model);
    pQVar5 = in_RDI->model;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x75205b);
    QFileDialogOptions::filter();
    QFileSystemModel::setFilter((QFlags_conflict1 *)pQVar5);
    pQVar5 = in_RDI->model;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
               (size_t)in_stack_fffffffffffff630);
    str.m_data._0_4_ = in_stack_fffffffffffff648;
    str.m_size = (qsizetype)in_stack_fffffffffffff640;
    str.m_data._4_4_ = in_stack_fffffffffffff64c.i;
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),str);
    QObject::setObjectName((QAnyStringView *)pQVar5);
    pQVar6 = platformFileDialogHelper((QFileDialogPrivate *)0x7520fd);
    if (pQVar6 == (QPlatformFileDialogHelper *)0x0) {
      QFileSystemModel::setNameFilterDisables(SUB81(in_RDI->model,0));
    }
    else {
      pQVar5 = in_RDI->model;
      (**(code **)(*(long *)pQVar6 + 0x80))();
      QFileSystemModel::setNameFilterDisables(SUB81(pQVar5,0));
    }
    pQVar7 = QFileSystemModel::d_func((QFileSystemModel *)0x752177);
    pQVar7[0x1b4] = (QFileSystemModelPrivate)0x1;
    local_60 = fileRenamed;
    qStack_58 = 0;
    QObjectPrivate::
    connect<void(QFileSystemModel::*)(QString_const&,QString_const&,QString_const&),void(QFileDialogPrivate::*)(QString_const&,QString_const&,QString_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(local_50);
    local_78 = pathChanged;
    qStack_70 = 0;
    QObjectPrivate::
    connect<void(QFileSystemModel::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_68);
    local_90 = rowsInserted;
    uStack_88._0_4_ = 0;
    uStack_88._4_4_ = 0;
    pcVar17 = rowsInserted;
    this_04 = (QList<QUrl> *)0x0;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_80);
    QFileSystemModel::setReadOnly(SUB81(in_RDI->model,0));
    this_01 = &in_RDI->qFileDialogUi;
    puVar8 = (undefined8 *)operator_new(0xd0);
    pQVar22 = (QFileDialogPrivate *)0x0;
    puVar8[0x18] = 0;
    puVar8[0x19] = 0;
    puVar8[0x16] = 0;
    puVar8[0x17] = 0;
    puVar8[0x14] = 0;
    puVar8[0x15] = 0;
    puVar8[0x12] = 0;
    puVar8[0x13] = 0;
    puVar8[0x10] = 0;
    puVar8[0x11] = 0;
    puVar8[0xe] = 0;
    puVar8[0xf] = 0;
    puVar8[0xc] = 0;
    puVar8[0xd] = 0;
    puVar8[10] = 0;
    puVar8[0xb] = 0;
    puVar8[8] = 0;
    puVar8[9] = 0;
    puVar8[6] = 0;
    puVar8[7] = 0;
    puVar8[4] = 0;
    puVar8[5] = 0;
    puVar8[2] = 0;
    puVar8[3] = 0;
    *puVar8 = 0;
    puVar8[1] = 0;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::reset
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_04,
               (Ui_QFileDialog *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    Ui_QFileDialog::setupUi(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_98 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_a0 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QUrl>::QList((QList<QUrl> *)0x752423);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),(size_t)this_04
              );
    latin1.m_data._0_4_ = in_stack_fffffffffffff668;
    latin1.m_size = in_stack_fffffffffffff660;
    latin1.m_data._4_4_ = in_stack_fffffffffffff66c;
    QString::QString((QString *)in_stack_fffffffffffff640,latin1);
    QUrl::QUrl(&local_b0,(QString *)local_c8,TolerantMode);
    QList<QUrl>::operator<<(this_04,(rvalue_ref)pcVar17);
    QDir::homePath();
    QUrl::fromLocalFile((QString *)&local_d0);
    QList<QUrl>::operator<<(this_04,(rvalue_ref)pcVar17);
    QUrl::~QUrl(&local_d0);
    QString::~QString((QString *)0x75250b);
    QUrl::~QUrl(&local_b0);
    QString::~QString((QString *)0x752525);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QSidebar::setModelAndUrls
              (in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_100 = goToUrl;
    pQStack_f8 = (QWidget *)0x0;
    QObjectPrivate::connect<void(QSidebar::*)(QUrl_const&),void(QFileDialogPrivate::*)(QUrl_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(local_f0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_110._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
         (tuple<QWExtra_*,_std::default_delete<QWExtra>_>)
         (_Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>)0x0;
    local_118 = 0x1b9;
    QObject::connect<void(QDialogButtonBox::*)(),void(QFileDialog::*)()>
              ((Object *)in_stack_fffffffffffff680,
               (offset_in_QDialogButtonBox_to_subr)in_stack_fffffffffffff6a0,
               (ContextType *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678),
               (offset_in_QFileDialog_to_subr *)in_stack_fffffffffffff670,in_stack_fffffffffffff6c0)
    ;
    QMetaObject::Connection::~Connection(&local_108);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_128 = 0;
    local_130 = 0x1c1;
    QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
              ((Object *)in_stack_fffffffffffff680,
               (offset_in_QDialogButtonBox_to_subr)in_stack_fffffffffffff6a0,
               (ContextType *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678),
               (offset_in_QDialog_to_subr *)in_stack_fffffffffffff670,in_stack_fffffffffffff6c0);
    QMetaObject::Connection::~Connection(&local_120);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QFileDialogComboBox::setFileDialogPrivate
              (in_stack_fffffffffffff640,
               (QFileDialogPrivate *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_148 = goToDirectory;
    uStack_140 = 0;
    policy = NoInsert;
    parent = (QObject *)0x0;
    QObjectPrivate::
    connect<void(QComboBox::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_138);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QComboBox::setInsertPolicy((QComboBox *)parent,policy);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QComboBox::setDuplicatesEnabled((QComboBox *)parent,SUB41(policy >> 0x18,0));
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (this_01);
    QFileDialogLineEdit::setFileDialogPrivate(pUVar9->fileNameEdit,in_RDI);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QLabel::setBuddy(in_stack_fffffffffffff680,
                     (QWidget *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
    pQVar10 = (QFSCompleter *)operator_new(0x20);
    QFSCompleter::QFSCompleter
              ((QFSCompleter *)in_stack_fffffffffffff640,
               (QFileSystemModel *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
               parent);
    in_RDI->completer = pQVar10;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QLineEdit::setCompleter
              ((QLineEdit *)in_stack_fffffffffffff650,
               (QCompleter *)CONCAT44(in_stack_fffffffffffff64c.i,in_stack_fffffffffffff648));
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QFlags<Qt::InputMethodHint>::QFlags((QFlags<Qt::InputMethodHint> *)parent,policy);
    QWidget::setInputMethodHints
              ((QWidget *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
               (InputMethodHints)in_stack_fffffffffffff64c.i);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_168 = autoCompleteFileName;
    uStack_160 = 0;
    QObjectPrivate::
    connect<void(QLineEdit::*)(QString_const&),void(QFileDialogPrivate::*)(QString_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(local_158);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_188._8_8_ = updateOkButton;
    uStack_178 = 0;
    uVar16 = 0;
    pQVar12 = (QWidget *)0x0;
    QObjectPrivate::connect<void(QLineEdit::*)(QString_const&),void(QFileDialogPrivate::*)()>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_170);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_190 = 0;
    local_198 = 0x1b9;
    uVar16 = uVar16 & 0xffffffff00000000;
    pQVar20 = (QFileDialogPrivate *)local_188;
    QObject::connect<void(QLineEdit::*)(),void(QFileDialog::*)()>
              ((Object *)in_stack_fffffffffffff680,
               (offset_in_QLineEdit_to_subr)in_stack_fffffffffffff6a0,
               (ContextType *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678),
               (offset_in_QFileDialog_to_subr *)in_stack_fffffffffffff670,in_stack_fffffffffffff6c0)
    ;
    QMetaObject::Connection::~Connection((Connection *)pQVar20);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QComboBox::setDuplicatesEnabled((QComboBox *)pQVar12,SUB81(uVar16 >> 0x38,0));
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QComboBox::setSizeAdjustPolicy
              (&in_stack_fffffffffffff640->super_QComboBox,in_stack_fffffffffffff63c);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QWidget::setSizePolicy(pQVar12,(Policy)(uVar16 >> 0x20),(Policy)uVar16);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_1b0 = useNameFilter;
    uStack_1a8 = 0;
    QObjectPrivate::connect<void(QComboBox::*)(int),void(QFileDialogPrivate::*)(int)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_1a0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_1c8 = QFileDialog::filterSelected;
    local_1c0 = 0;
    QObject::connect<void(QComboBox::*)(QString_const&),void(QFileDialog::*)(QString_const&)>
              ((Object *)in_stack_fffffffffffff680,
               (offset_in_QComboBox_to_subr)in_stack_fffffffffffff6a0,
               (ContextType *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678),
               (offset_in_QFileDialog_to_subr *)in_stack_fffffffffffff670,in_stack_fffffffffffff6c0)
    ;
    QMetaObject::Connection::~Connection(&local_1b8);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QFileDialogListView::setFileDialogPrivate
              ((QFileDialogListView *)in_stack_fffffffffffff640,
               (QFileDialogPrivate *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (this_01);
    (**(code **)(*(long *)&(pUVar9->listView->super_QListView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
              (pUVar9->listView,in_RDI->model);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_1e0 = enterDirectory;
    uStack_1d8 = 0;
    QObjectPrivate::
    connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_1d0);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    local_1f8 = showContextMenu;
    uStack_1f0 = 0;
    QObjectPrivate::
    connect<void(QWidget::*)(QPoint_const&),void(QFileDialogPrivate::*)(QPoint_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_1e8);
    pQVar11 = (QShortcut *)operator_new(0x10);
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (this_01);
    QShortcut::QShortcut
              (pQVar11,Delete,(QObject *)pUVar9->listView,(char *)0x0,(char *)0x0,WindowShortcut);
    local_210 = deleteCurrent;
    uStack_208 = 0;
    this_05 = (QTreeView *)0x0;
    QObjectPrivate::connect<void(QShortcut::*)(),void(QFileDialogPrivate::*)()>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_200);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    QFileDialogTreeView::setFileDialogPrivate
              ((QFileDialogTreeView *)in_stack_fffffffffffff640,
               (QFileDialogPrivate *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (this_01);
    (**(code **)(*(long *)&(pUVar9->treeView->super_QTreeView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
              (pUVar9->treeView,in_RDI->model);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->(this_01);
    pQVar12 = (QWidget *)QTreeView::header(this_05);
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar13 = QWidget::font((QWidget *)this_00);
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_218,pQVar13);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),(size_t)this_05
              );
    latin1_00.m_data._0_4_ = in_stack_fffffffffffff668;
    latin1_00.m_size = in_stack_fffffffffffff660;
    latin1_00.m_data._4_4_ = in_stack_fffffffffffff66c;
    QString::QString((QString *)in_stack_fffffffffffff640,latin1_00);
    QFontMetrics::horizontalAdvance((QString *)&local_218,(int)local_230);
    QHeaderView::resizeSection
              ((QHeaderView *)in_stack_fffffffffffff688,
               (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),(int)in_stack_fffffffffffff6c8);
    QString::~QString((QString *)0x753055);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),(size_t)this_05
              );
    latin1_01.m_data._0_4_ = in_stack_fffffffffffff668;
    latin1_01.m_size = in_stack_fffffffffffff660;
    latin1_01.m_data._4_4_ = in_stack_fffffffffffff66c;
    QString::QString((QString *)in_stack_fffffffffffff640,latin1_01);
    QFontMetrics::horizontalAdvance((QString *)&local_218,(int)local_248);
    QHeaderView::resizeSection
              ((QHeaderView *)in_stack_fffffffffffff688,
               (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),(int)in_stack_fffffffffffff6c8);
    QString::~QString((QString *)0x7530f2);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),(size_t)this_05
              );
    latin1_02.m_data._0_4_ = in_stack_fffffffffffff668;
    latin1_02.m_size = in_stack_fffffffffffff660;
    latin1_02.m_data._4_4_ = in_stack_fffffffffffff66c;
    QString::QString((QString *)in_stack_fffffffffffff640,latin1_02);
    QFontMetrics::horizontalAdvance((QString *)&local_218,(int)local_260);
    QHeaderView::resizeSection
              ((QHeaderView *)in_stack_fffffffffffff688,
               (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),(int)in_stack_fffffffffffff6c8);
    QString::~QString((QString *)0x75318f);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),(size_t)this_05
              );
    latin1_03.m_data._0_4_ = in_stack_fffffffffffff668;
    latin1_03.m_size = in_stack_fffffffffffff660;
    latin1_03.m_data._4_4_ = in_stack_fffffffffffff66c;
    QString::QString((QString *)in_stack_fffffffffffff640,latin1_03);
    QFontMetrics::horizontalAdvance((QString *)&local_218,(int)local_278);
    QHeaderView::resizeSection
              ((QHeaderView *)in_stack_fffffffffffff688,
               (int)((ulong)in_stack_fffffffffffff6c8 >> 0x20),(int)in_stack_fffffffffffff6c8);
    QString::~QString((QString *)0x753225);
    QWidget::setContextMenuPolicy(pQVar12,ActionsContextMenu);
    this_02 = (QActionGroup *)operator_new(0x10);
    QActionGroup::QActionGroup(this_02,(QObject *)this_00);
    QActionGroup::setExclusive(SUB81(this_02,0));
    local_290 = QFileDialogPrivate::showHeader;
    local_288 = 0;
    pcVar17 = QFileDialogPrivate::showHeader;
    pQVar12 = (QWidget *)0x0;
    QObjectPrivate::connect<void(QActionGroup::*)(QAction*),void(QFileDialogPrivate::*)(QAction*)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,
               (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20));
    QMetaObject::Connection::~Connection(&local_280);
    local_690 = in_RDI->model;
    if (in_RDI->proxyModel != (QAbstractProxyModel *)0x0) {
      local_690 = (QFileSystemModel *)in_RDI->proxyModel;
    }
    local_694 = 1;
    while( true ) {
      QModelIndex::QModelIndex((QModelIndex *)0x75337b);
      iVar4 = (**(code **)(*(long *)local_690 + 0x80))(local_690,local_2a8);
      type = (ConnectionType)((ulong)in_stack_fffffffffffff680 >> 0x20);
      if (iVar4 <= local_694) break;
      this_03 = (QAction *)operator_new(0x10);
      QAction::QAction(this_03,(QObject *)this_02);
      QAction::setCheckable(SUB81(this_03,0));
      QAction::setChecked(SUB81(this_03,0));
      QWidget::addAction(pQVar12,(QAction *)pcVar17);
      local_694 = local_694 + 1;
    }
    local_2b0.d = (QItemSelectionModel *)&DAT_aaaaaaaaaaaaaaaa;
    this_08 = (QFileDialogPrivate *)&in_RDI->qFileDialogUi;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_08);
    pQVar14 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar12);
    QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_>::QScopedPointer
              (&local_2b0,pQVar14);
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                        this_08);
    pQVar1 = pUVar9->treeView;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_08);
    pQVar14 = QAbstractItemView::selectionModel((QAbstractItemView *)pQVar12);
    (**(code **)(*(long *)&(pQVar1->super_QTreeView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
              (pQVar1,pQVar14);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_08);
    local_2c8 = enterDirectory;
    uStack_2c0 = 0;
    QObjectPrivate::
    connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,type);
    QMetaObject::Connection::~Connection(&local_2b8);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_08);
    local_2e0 = showContextMenu;
    uStack_2d8 = 0;
    QObjectPrivate::
    connect<void(QWidget::*)(QPoint_const&),void(QFileDialogPrivate::*)(QPoint_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,type);
    QMetaObject::Connection::~Connection(&local_2d0);
    pQVar11 = (QShortcut *)operator_new(0x10);
    pUVar9 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                        this_08);
    QShortcut::QShortcut
              (pQVar11,Delete,(QObject *)pUVar9->treeView,(char *)0x0,(char *)0x0,WindowShortcut);
    local_2f8 = deleteCurrent;
    uStack_2f0 = 0;
    this_06 = (QAbstractItemView *)0x0;
    QObjectPrivate::connect<void(QShortcut::*)(),void(QFileDialogPrivate::*)()>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,type);
    QMetaObject::Connection::~Connection(&local_2e8);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)this_08);
    QAbstractItemView::selectionModel(this_06);
    local_310 = selectionChanged;
    uStack_308 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QFileDialogPrivate::*)()>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,type);
    QMetaObject::Connection::~Connection(&local_300);
    local_328 = currentChanged;
    local_320 = 0;
    pcVar17 = currentChanged;
    this_07 = (QFileDialog *)0x0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)CONCAT17(in_stack_fffffffffffff697,in_stack_fffffffffffff690),
               CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0),
               in_stack_fffffffffffff688,in_stack_fffffffffffff6b0,type);
    QMetaObject::Connection::~Connection(&local_318);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&in_RDI->qFileDialogUi);
    QSplitter::widget((QSplitter *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                      (int)((ulong)this_07 >> 0x20));
    QSplitter::indexOf((QSplitter *)CONCAT44(in_stack_fffffffffffff64c.i,in_stack_fffffffffffff648),
                       (QWidget *)in_stack_fffffffffffff640);
    QSplitter::setStretchFactor
              ((QSplitter *)in_stack_fffffffffffff640,in_stack_fffffffffffff63c,
               in_stack_fffffffffffff638);
    createToolButtons(pQVar22);
    createMenuActions(pQVar20);
    bVar2 = restoreFromSettings(this_08);
    if (!bVar2) {
      local_338 = &DAT_aaaaaaaaaaaaaaaa;
      local_330 = &DAT_aaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT44(in_stack_fffffffffffff64c.i,in_stack_fffffffffffff648),
                 (size_t)in_stack_fffffffffffff640);
      QString::QString((QString *)0x753912);
      QSettings::QSettings
                ((QSettings *)&local_338,UserScope,(QString *)local_350,(QString *)local_368,
                 (QObject *)0x0);
      QString::~QString((QString *)0x753943);
      QString::~QString((QString *)0x753950);
      std::data<char_const,14ul>((char (*) [14])"Qt/filedialog");
      QtPrivate::lengthHelperContainer<char,14ul>((char (*) [14])0x7539b1);
      QAnyStringView::QAnyStringView<char,_true>
                ((QAnyStringView *)in_stack_fffffffffffff640,
                 (char *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638),
                 (qsizetype)this_07);
      QSettings::value((QAnyStringView *)&local_28);
      ::QVariant::toByteArray();
      QFileDialog::restoreState
                ((QFileDialog *)in_stack_fffffffffffff650,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffff64c.i,in_stack_fffffffffffff648));
      QByteArray::~QByteArray((QByteArray *)0x753a25);
      ::QVariant::~QVariant(&local_28);
      QSettings::~QSettings((QSettings *)&local_338);
    }
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753a60);
    QFileDialogOptions::fileMode();
    QFileDialog::setFileMode((QFileDialog *)in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
    pQVar20 = this_00;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753a98);
    QFileDialogOptions::acceptMode();
    QFileDialog::setAcceptMode((QFileDialog *)in_stack_fffffffffffff650,in_stack_fffffffffffff64c.i)
    ;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753ad3);
    QFileDialogOptions::viewMode();
    QFileDialog::setViewMode(this_07,(ViewMode)((ulong)pcVar17 >> 0x20));
    pQVar22 = this_00;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753b0e);
    options.i = (Int)((ulong)pQVar22 >> 0x20);
    local_39c = QFileDialogOptions::options();
    value = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_39c);
    QFlag::QFlag(local_398,value);
    QFlags<QFileDialog::Option>::QFlagsStorageHelper
              ((QFlags<QFileDialog::Option> *)pcVar17,(QFlag)(int)((ulong)this_07 >> 0x20));
    QFileDialog::setOptions(in_stack_fffffffffffff658,(Options)options.i);
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753b75);
    QFileDialogOptions::sidebarUrls();
    bVar2 = QList<QUrl>::isEmpty((QList<QUrl> *)0x753b92);
    uVar21 = (uint)bVar2 << 0x18 ^ 0xff000000;
    QList<QUrl>::~QList((QList<QUrl> *)0x753ba8);
    if ((uVar21 & 0x1000000) != 0) {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753bd6)
      ;
      QFileDialogOptions::sidebarUrls();
      QFileDialog::setSidebarUrls(this_07,(QList<QUrl> *)pcVar17);
      QList<QUrl>::~QList((QList<QUrl> *)0x753c05);
    }
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753c26);
    QFileDialogOptions::initialDirectory();
    QFileDialog::setDirectoryUrl
              ((QFileDialog *)in_stack_fffffffffffff640,
               (QUrl *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    QUrl::~QUrl(local_3d8);
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753c69);
    QFileDialogOptions::mimeTypeFilters();
    bVar2 = QList<QString>::isEmpty((QList<QString> *)0x753c86);
    bVar3 = bVar2 ^ 0xff;
    QList<QString>::~QList((QList<QString> *)0x753c99);
    if ((bVar3 & 1) == 0) {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753d0c)
      ;
      QFileDialogOptions::nameFilters();
      bVar2 = QList<QString>::isEmpty((QList<QString> *)0x753d29);
      in_stack_fffffffffffff67f = bVar2 ^ 0xff;
      QList<QString>::~QList((QList<QString> *)0x753d3c);
      if ((in_stack_fffffffffffff67f & 1) != 0) {
        in_stack_fffffffffffff670 = this_00;
        QSharedPointer<QFileDialogOptions>::operator->
                  ((QSharedPointer<QFileDialogOptions> *)0x753d67);
        QFileDialogOptions::nameFilters();
        QFileDialog::setNameFilters
                  (in_stack_fffffffffffff658,(QStringList *)in_stack_fffffffffffff650);
        QList<QString>::~QList((QList<QString> *)0x753d96);
      }
    }
    else {
      QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753cc4)
      ;
      QFileDialogOptions::mimeTypeFilters();
      QFileDialog::setMimeTypeFilters
                ((QFileDialog *)in_stack_fffffffffffff650,
                 (QStringList *)CONCAT44(in_stack_fffffffffffff64c.i,in_stack_fffffffffffff648));
      QList<QString>::~QList((QList<QString> *)0x753cf3);
    }
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753db9);
    QFileDialogOptions::initiallySelectedNameFilter();
    QFileDialog::selectNameFilter
              ((QFileDialog *)CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678),
               (QString *)in_stack_fffffffffffff670);
    QString::~QString((QString *)0x753de8);
    pQVar22 = this_00;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753e09);
    QFileDialogOptions::defaultSuffix();
    QFileDialog::setDefaultSuffix(this_07,(QString *)pcVar17);
    QString::~QString((QString *)0x753e38);
    uVar18 = SUB84(this_00,0);
    uVar19 = (undefined4)((ulong)this_00 >> 0x20);
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753e59);
    QFileDialogOptions::history();
    QFileDialog::setHistory(this_07,(QStringList *)pcVar17);
    flags = (ComponentFormattingOption)((ulong)pcVar17 >> 0x20);
    QList<QString>::~QList((QList<QString> *)0x753e88);
    local_498 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_490 = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
    QSharedPointer<QFileDialogOptions>::operator->((QSharedPointer<QFileDialogOptions> *)0x753ec9);
    QFileDialogOptions::initiallySelectedFiles();
    qVar15 = QList<QUrl>::size((QList<QUrl> *)&local_498);
    if (qVar15 == 1) {
      in_stack_fffffffffffff650 = this_00;
      QList<QUrl>::first((QList<QUrl> *)this_07);
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)this_07,flags);
      QUrl::fileName((QFlags_conflict1 *)local_4b0);
      QFileDialog::selectFile((QFileDialog *)CONCAT44(uVar19,uVar18),(QString *)pQVar22);
      QString::~QString((QString *)0x753f55);
    }
    local_4c0[0].i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
    local_4c0[0] = QList<QUrl>::begin((QList<QUrl> *)this_07);
    o = QList<QUrl>::end((QList<QUrl> *)this_07);
    while( true ) {
      bVar2 = QList<QUrl>::const_iterator::operator!=(local_4c0,o);
      newstate.i = (Int)((ulong)in_stack_fffffffffffff670 >> 0x20);
      if (!bVar2) break;
      QList<QUrl>::const_iterator::operator*(local_4c0);
      QFileDialog::selectUrl
                ((QFileDialog *)in_stack_fffffffffffff640,
                 (QUrl *)CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
      QList<QUrl>::const_iterator::operator++(local_4c0);
    }
    lineEdit((QFileDialogPrivate *)0x754042);
    QLineEdit::selectAll((QLineEdit *)this_07);
    updateOkButton(pQVar20);
    retranslateStrings((QFileDialogPrivate *)
                       CONCAT17(in_stack_fffffffffffff67f,in_stack_fffffffffffff678));
    bVar2 = QSize::isValid((QSize *)this_00);
    if (!bVar2) {
      (**(code **)(*(long *)&(this_00->super_QDialogPrivate).super_QWidgetPrivate + 0x70))();
    }
    QWidget::resize((QWidget *)CONCAT44(uVar19,uVar18),(QSize *)pQVar22);
    QWidget::setWindowState((QWidget *)in_stack_fffffffffffff650,(WindowStates)newstate.i);
    QList<QUrl>::~QList((QList<QUrl> *)0x7540ed);
    QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_>::
    ~QScopedPointer((QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_>
                     *)this_07);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_218);
    QList<QUrl>::~QList((QList<QUrl> *)0x754114);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::createWidgets()
{
    if (qFileDialogUi)
        return;
    Q_Q(QFileDialog);

    // This function is sometimes called late (e.g as a fallback from setVisible). In that case we
    // need to ensure that the following UI code (setupUI in particular) doesn't reset any explicitly
    // set window state or geometry.
    QSize preSize = q->testAttribute(Qt::WA_Resized) ? q->size() : QSize();
    Qt::WindowStates preState = q->windowState();

    model = new QFileSystemModel(q);
    model->setIconProvider(&defaultIconProvider);
    model->setFilter(options->filter());
    model->setObjectName("qt_filesystem_model"_L1);
    if (QPlatformFileDialogHelper *helper = platformFileDialogHelper())
        model->setNameFilterDisables(helper->defaultNameFilterDisables());
    else
        model->setNameFilterDisables(false);
    model->d_func()->disableRecursiveSort = true;
    QObjectPrivate::connect(model, &QFileSystemModel::fileRenamed,
                            this, &QFileDialogPrivate::fileRenamed);
    QObjectPrivate::connect(model, &QFileSystemModel::rootPathChanged,
                            this, &QFileDialogPrivate::pathChanged);
    QObjectPrivate::connect(model, &QFileSystemModel::rowsInserted,
                            this, &QFileDialogPrivate::rowsInserted);
    model->setReadOnly(false);

    qFileDialogUi.reset(new Ui_QFileDialog());
    qFileDialogUi->setupUi(q);

    QList<QUrl> initialBookmarks;
    initialBookmarks << QUrl("file:"_L1)
                     << QUrl::fromLocalFile(QDir::homePath());
    qFileDialogUi->sidebar->setModelAndUrls(model, initialBookmarks);
    QObjectPrivate::connect(qFileDialogUi->sidebar, &QSidebar::goToUrl,
                            this, &QFileDialogPrivate::goToUrl);

    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::accepted,
                     q, &QFileDialog::accept);
    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::rejected,
                     q, &QFileDialog::reject);

    qFileDialogUi->lookInCombo->setFileDialogPrivate(this);
    QObjectPrivate::connect(qFileDialogUi->lookInCombo, &QComboBox::textActivated,
                            this, &QFileDialogPrivate::goToDirectory);

    qFileDialogUi->lookInCombo->setInsertPolicy(QComboBox::NoInsert);
    qFileDialogUi->lookInCombo->setDuplicatesEnabled(false);

    // filename
    qFileDialogUi->fileNameEdit->setFileDialogPrivate(this);
#ifndef QT_NO_SHORTCUT
    qFileDialogUi->fileNameLabel->setBuddy(qFileDialogUi->fileNameEdit);
#endif
#if QT_CONFIG(fscompleter)
    completer = new QFSCompleter(model, q);
    qFileDialogUi->fileNameEdit->setCompleter(completer);
#endif // QT_CONFIG(fscompleter)

    qFileDialogUi->fileNameEdit->setInputMethodHints(Qt::ImhNoPredictiveText);

    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::autoCompleteFileName);
    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::updateOkButton);
    QObject::connect(qFileDialogUi->fileNameEdit, &QLineEdit::returnPressed,
                     q, &QFileDialog::accept);

    // filetype
    qFileDialogUi->fileTypeCombo->setDuplicatesEnabled(false);
    qFileDialogUi->fileTypeCombo->setSizeAdjustPolicy(QComboBox::AdjustToContentsOnFirstShow);
    qFileDialogUi->fileTypeCombo->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
    QObjectPrivate::connect(qFileDialogUi->fileTypeCombo, &QComboBox::activated,
                            this, &QFileDialogPrivate::useNameFilter);
    QObject::connect(qFileDialogUi->fileTypeCombo, &QComboBox::textActivated,
                     q, &QFileDialog::filterSelected);

    qFileDialogUi->listView->setFileDialogPrivate(this);
    qFileDialogUi->listView->setModel(model);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    QShortcut *shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->listView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    qFileDialogUi->treeView->setFileDialogPrivate(this);
    qFileDialogUi->treeView->setModel(model);
    QHeaderView *treeHeader = qFileDialogUi->treeView->header();
    QFontMetrics fm(q->font());
    treeHeader->resizeSection(0, fm.horizontalAdvance("wwwwwwwwwwwwwwwwwwwwwwwwww"_L1));
    treeHeader->resizeSection(1, fm.horizontalAdvance("128.88 GB"_L1));
    treeHeader->resizeSection(2, fm.horizontalAdvance("mp3Folder"_L1));
    treeHeader->resizeSection(3, fm.horizontalAdvance("10/29/81 02:02PM"_L1));
    treeHeader->setContextMenuPolicy(Qt::ActionsContextMenu);

    QActionGroup *showActionGroup = new QActionGroup(q);
    showActionGroup->setExclusive(false);
    QObjectPrivate::connect(showActionGroup, &QActionGroup::triggered,
                            this, &QFileDialogPrivate::showHeader);

    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    for (int i = 1; i < abstractModel->columnCount(QModelIndex()); ++i) {
        QAction *showHeader = new QAction(showActionGroup);
        showHeader->setCheckable(true);
        showHeader->setChecked(true);
        treeHeader->addAction(showHeader);
    }

    QScopedPointer<QItemSelectionModel> selModel(qFileDialogUi->treeView->selectionModel());
    qFileDialogUi->treeView->setSelectionModel(qFileDialogUi->listView->selectionModel());

    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->treeView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    // Selections
    QItemSelectionModel *selections = qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            this, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            this, &QFileDialogPrivate::currentChanged);
    qFileDialogUi->splitter->setStretchFactor(qFileDialogUi->splitter->indexOf(qFileDialogUi->splitter->widget(1)), QSizePolicy::Expanding);

    createToolButtons();
    createMenuActions();

#if QT_CONFIG(settings)
    // Try to restore from the FileDialog settings group; if it fails, fall back
    // to the pre-5.5 QByteArray serialized settings.
    if (!restoreFromSettings()) {
        const QSettings settings(QSettings::UserScope, u"QtProject"_s);
        q->restoreState(settings.value("Qt/filedialog").toByteArray());
    }
#endif

    // Initial widget states from options
    q->setFileMode(static_cast<QFileDialog::FileMode>(options->fileMode()));
    q->setAcceptMode(static_cast<QFileDialog::AcceptMode>(options->acceptMode()));
    q->setViewMode(static_cast<QFileDialog::ViewMode>(options->viewMode()));
    q->setOptions(static_cast<QFileDialog::Options>(static_cast<int>(options->options())));
    if (!options->sidebarUrls().isEmpty())
        q->setSidebarUrls(options->sidebarUrls());
    q->setDirectoryUrl(options->initialDirectory());
#if QT_CONFIG(mimetype)
    if (!options->mimeTypeFilters().isEmpty())
        q->setMimeTypeFilters(options->mimeTypeFilters());
    else
#endif
    if (!options->nameFilters().isEmpty())
        q->setNameFilters(options->nameFilters());
    q->selectNameFilter(options->initiallySelectedNameFilter());
    q->setDefaultSuffix(options->defaultSuffix());
    q->setHistory(options->history());
    const auto initiallySelectedFiles = options->initiallySelectedFiles();
    if (initiallySelectedFiles.size() == 1)
        q->selectFile(initiallySelectedFiles.first().fileName());
    for (const QUrl &url : initiallySelectedFiles)
        q->selectUrl(url);
    lineEdit()->selectAll();
    updateOkButton();
    retranslateStrings();
    q->resize(preSize.isValid() ? preSize : q->sizeHint());
    q->setWindowState(preState);
}